

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O1

json_iterator __thiscall JSONNode::begin(JSONNode *this)

{
  internalJSONNode *piVar1;
  undefined8 *in_RSI;
  
  piVar1 = (internalJSONNode *)*in_RSI;
  if (1 < piVar1->refcount) {
    piVar1->refcount = piVar1->refcount - 1;
    piVar1 = internalJSONNode::newInternal(piVar1);
  }
  *in_RSI = piVar1;
  if ((piVar1->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(piVar1);
    piVar1 = (internalJSONNode *)piVar1->Children->array;
  }
  else {
    piVar1 = (internalJSONNode *)0x0;
  }
  this->internal = piVar1;
  return (json_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::json_iterator JSONNode::begin(void) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("begin"));
	   makeUniqueInternal();
	   return json_iterator(internal -> begin());
    }